

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O1

Rect __thiscall
SkylineBinPack::FindPositionForNewNodeBottomLeft
          (SkylineBinPack *this,int width,int height,int *bestHeight,int *bestWidth,int *bestIndex)

{
  int iVar1;
  SkylineNode *pSVar2;
  Rect RVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  Rect newNode;
  int y;
  Rect local_68;
  int local_4c;
  int *local_48;
  DisjointRectCollection *local_40;
  int *local_38;
  
  *bestHeight = 0x7fffffff;
  *bestIndex = -1;
  *bestWidth = 0x7fffffff;
  local_68.x = 0;
  local_68.y = 0;
  local_68.width = 0;
  local_68.height = 0;
  if ((this->skyLine).Count != 0) {
    local_40 = &this->disjointRects;
    lVar6 = 8;
    uVar5 = 0;
    local_48 = bestWidth;
    local_38 = bestIndex;
    do {
      bVar4 = RectangleFits(this,(int)uVar5,width,height,&local_4c);
      if (bVar4) {
        iVar1 = local_4c + height;
        if ((iVar1 < *bestHeight) ||
           ((iVar1 == *bestHeight &&
            (*(int *)((long)&((this->skyLine).Array)->x + lVar6) < *local_48)))) {
          *bestHeight = iVar1;
          *local_38 = (int)uVar5;
          pSVar2 = (this->skyLine).Array;
          *local_48 = *(int *)((long)&pSVar2->x + lVar6);
          local_68.x = *(int *)((long)pSVar2 + lVar6 + -8);
          local_68.y = local_4c;
          local_68.width = width;
          local_68.height = height;
          bVar4 = DisjointRectCollection::Disjoint(local_40,&local_68);
          if (!bVar4) {
            __assert_fail("disjointRects.Disjoint(newNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                          ,0x138,
                          "Rect SkylineBinPack::FindPositionForNewNodeBottomLeft(int, int, int &, int &, int &) const"
                         );
          }
        }
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0xc;
    } while (uVar5 < (this->skyLine).Count);
  }
  RVar3.y = local_68.y;
  RVar3.x = local_68.x;
  RVar3.width = local_68.width;
  RVar3.height = local_68.height;
  return RVar3;
}

Assistant:

Rect SkylineBinPack::FindPositionForNewNodeBottomLeft(int width, int height, int &bestHeight, int &bestWidth, int &bestIndex) const
{
	bestHeight = INT_MAX;
	bestIndex = -1;
	// Used to break ties if there are nodes at the same level. Then pick the narrowest one.
	bestWidth = INT_MAX;
	Rect newNode = { 0, 0, 0, 0 };
	for(unsigned i = 0; i < skyLine.Size(); ++i)
	{
		int y;
		if (RectangleFits(i, width, height, y))
		{
			if (y + height < bestHeight || (y + height == bestHeight && skyLine[i].width < bestWidth))
			{
				bestHeight = y + height;
				bestIndex = i;
				bestWidth = skyLine[i].width;
				newNode.x = skyLine[i].x;
				newNode.y = y;
				newNode.width = width;
				newNode.height = height;
#ifdef _DEBUG
				assert(disjointRects.Disjoint(newNode));
#endif
			}
		}
/*		if (RectangleFits(i, height, width, y))
		{
			if (y + width < bestHeight || (y + width == bestHeight && skyLine[i].width < bestWidth))
			{
				bestHeight = y + width;
				bestIndex = i;
				bestWidth = skyLine[i].width;
				newNode.x = skyLine[i].x;
				newNode.y = y;
				newNode.width = height;
				newNode.height = width;
				assert(disjointRects.Disjoint(newNode));
			}
		}
*/	}

	return newNode;
}